

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry.c
# Opt level: O3

wchar_t ui_entry_search_categories(ui_entry *entry,char *name,int *ind)

{
  category_reference *pcVar1;
  int iVar2;
  wchar_t wVar3;
  wchar_t wVar4;
  wchar_t wVar5;
  
  wVar5 = entry->n_category;
  if (wVar5 == L'\0') {
    wVar4 = L'\0';
    wVar3 = L'\0';
  }
  else {
    pcVar1 = entry->categories;
    wVar3 = L'\0';
    do {
      wVar4 = (wVar5 + wVar3) / 2;
      iVar2 = strcmp(pcVar1[wVar4].name,name);
      if (iVar2 == 0) {
        wVar3 = L'\x01';
        goto LAB_001e133c;
      }
      if (iVar2 < 0) {
        wVar3 = wVar4 + L'\x01';
        wVar4 = wVar5;
      }
      wVar5 = wVar4;
    } while (wVar3 != wVar5);
    wVar3 = L'\0';
    wVar4 = wVar5;
  }
LAB_001e133c:
  *ind = wVar4;
  return wVar3;
}

Assistant:

static int ui_entry_search_categories(const struct ui_entry *entry,
	const char *name, int *ind)
{
	/* They're sorted by name so use a binary search. */
	int ilow = 0, ihigh = entry->n_category;

	while (1) {
		int imid, cmp;

		if (ilow == ihigh) {
			*ind = ilow;
			return 0;
		}
		imid = (ilow + ihigh) / 2;
		cmp = strcmp(entry->categories[imid].name, name);
		if (cmp == 0) {
			*ind = imid;
			return 1;
		}
		if (cmp < 0) {
			ilow = imid + 1;
		} else {
			ihigh = imid;
		}
	}
}